

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

void __thiscall Rml::ElementScroll::UpdateScrollbar(ElementScroll *this,Orientation orientation)

{
  _Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_> this_00;
  float fVar1;
  float fVar2;
  float local_28;
  
  if (orientation == VERTICAL) {
    local_28 = Element::GetScrollTop(this->element);
    fVar1 = Element::GetScrollHeight(this->element);
    fVar2 = Element::GetClientHeight(this->element);
  }
  else {
    local_28 = Element::GetScrollLeft(this->element);
    fVar1 = Element::GetScrollWidth(this->element);
    fVar2 = Element::GetClientWidth(this->element);
  }
  this_00.super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl =
       this->scrollbars[orientation].widget._M_t.
       super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>._M_t.
       super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>.
       super__Head_base<0UL,_Rml::WidgetScroll_*,_false>;
  if (this_00.super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl != (WidgetScroll *)0x0)
  {
    fVar2 = (float)(-(uint)(0.0 < fVar1 - fVar2) & (uint)(local_28 / (fVar1 - fVar2)));
    fVar1 = 1.0;
    if (fVar2 <= 1.0) {
      fVar1 = fVar2;
    }
    fVar1 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar1);
    fVar2 = WidgetScroll::GetBarPosition
                      ((WidgetScroll *)
                       this_00.super__Head_base<0UL,_Rml::WidgetScroll_*,_false>._M_head_impl);
    if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
      WidgetScroll::SetBarPosition
                ((WidgetScroll *)
                 this->scrollbars[orientation].widget._M_t.
                 super___uniq_ptr_impl<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetScroll_*,_std::default_delete<Rml::WidgetScroll>_>
                 .super__Head_base<0UL,_Rml::WidgetScroll_*,_false>,fVar1);
      return;
    }
  }
  return;
}

Assistant:

void ElementScroll::UpdateScrollbar(Orientation orientation)
{
	float bar_position;
	float traversable_track;
	if (orientation == VERTICAL)
	{
		bar_position = element->GetScrollTop();
		traversable_track = element->GetScrollHeight() - element->GetClientHeight();
	}
	else
	{
		bar_position = element->GetScrollLeft();
		traversable_track = element->GetScrollWidth() - element->GetClientWidth();
	}

	if (traversable_track <= 0)
		bar_position = 0;
	else
		bar_position /= traversable_track;

	if (scrollbars[orientation].widget != nullptr)
	{
		bar_position = Math::Clamp(bar_position, 0.0f, 1.0f);

		if (scrollbars[orientation].widget->GetBarPosition() != bar_position)
			scrollbars[orientation].widget->SetBarPosition(bar_position);
	}
}